

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BranchAndBound.cpp
# Opt level: O3

void __thiscall tsbp::Packing2D::AddItem(Packing2D *this,Rectangle *rectangle,int itemId)

{
  pointer *ppRVar1;
  iterator __position;
  double dVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  
  __position._M_current =
       (this->Items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
       super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->Items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    CLI::std::vector<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>::
    _M_realloc_insert<tsbp::Rectangle>(&this->Items,__position,rectangle);
  }
  else {
    iVar4 = rectangle->X;
    iVar5 = rectangle->Y;
    iVar6 = rectangle->Dx;
    iVar7 = rectangle->Dy;
    iVar3 = rectangle->ExternId;
    dVar2 = rectangle->Area;
    (__position._M_current)->InternId = rectangle->InternId;
    (__position._M_current)->ExternId = iVar3;
    (__position._M_current)->Area = dVar2;
    (__position._M_current)->X = iVar4;
    (__position._M_current)->Y = iVar5;
    (__position._M_current)->Dx = iVar6;
    (__position._M_current)->Dy = iVar7;
    ppRVar1 = &(this->Items).super__Vector_base<tsbp::Rectangle,_std::allocator<tsbp::Rectangle>_>.
               _M_impl.super__Vector_impl_data._M_finish;
    *ppRVar1 = *ppRVar1 + 1;
  }
  if (itemId != -1) {
    boost::dynamic_bitset<unsigned_long,_std::allocator<unsigned_long>_>::set
              (&this->PlacedItems,(long)itemId,true);
    return;
  }
  return;
}

Assistant:

void Packing2D::AddItem(Rectangle&& rectangle, int itemId)
{
    Items.emplace_back(std::move(rectangle));

    if (itemId == -1)
    {
        return;
    }

    PlacedItems.set((size_t)itemId);
}